

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void scqf(int nt,double *t,int *mlt,double *wts,int param_5,int *ndx,double *swts,double *st,
         int kind,double alpha,double beta,double a,double b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_38;
  
  dVar9 = r8_epsilon();
  parchk(kind,1,alpha,beta);
  dVar11 = 0.0;
  local_38 = a;
  switch(kind) {
  case 1:
    dVar11 = r8_abs(b - a);
    if (dVar9 < dVar11) {
      local_38 = (a + b) * 0.5;
      dVar11 = (b - a) * 0.5;
      dVar9 = 0.0;
      alpha = 0.0;
      goto LAB_001d6c27;
    }
    break;
  case 2:
    dVar11 = r8_abs(b - a);
    if (dVar9 < dVar11) {
      alpha = -0.5;
LAB_001d6bf8:
      local_38 = (a + b) * 0.5;
      dVar11 = (b - a) * 0.5;
      dVar9 = alpha;
      goto LAB_001d6c27;
    }
    break;
  case 3:
    dVar11 = r8_abs(b - a);
    if (dVar9 < dVar11) {
      local_38 = (a + b) * 0.5;
      dVar11 = (b - a) * 0.5;
      dVar9 = alpha;
      goto LAB_001d6c27;
    }
    break;
  case 4:
    dVar11 = r8_abs(b - a);
    if (dVar9 < dVar11) {
      local_38 = (a + b) * 0.5;
      dVar11 = (b - a) * 0.5;
      dVar9 = beta;
      goto LAB_001d6c27;
    }
    break;
  case 5:
    if (b <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      pcVar5 = "  B <= 0\n";
      goto LAB_001d6d18;
    }
    dVar11 = 1.0 / b;
    goto LAB_001d6c22;
  case 6:
    if (b <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      pcVar5 = "  B <= 0.\n";
      goto LAB_001d6d18;
    }
    if (b < 0.0) {
      dVar11 = sqrt(b);
    }
    else {
      dVar11 = SQRT(b);
    }
    dVar11 = 1.0 / dVar11;
LAB_001d6c22:
    dVar9 = 0.0;
LAB_001d6c27:
    dVar9 = pow(dVar11,dVar9 + alpha + 1.0);
    if (0 < nt) {
      uVar4 = 0;
      do {
        st[uVar4] = t[uVar4] * dVar11 + local_38;
        iVar1 = ndx[uVar4];
        if (iVar1 != 0) {
          iVar6 = -iVar1;
          iVar3 = iVar1;
          if (iVar1 < 1) {
            iVar3 = iVar6;
          }
          iVar2 = mlt[uVar4];
          if (0 < iVar2) {
            if (iVar1 != iVar6 && SBORROW4(iVar1,iVar6) == iVar1 * 2 < 0) {
              iVar6 = iVar1;
            }
            uVar7 = iVar6 - 1;
            lVar8 = 0;
            dVar10 = dVar9;
            do {
              swts[(ulong)uVar7 + lVar8] = dVar10 * wts[(ulong)uVar7 + lVar8];
              lVar8 = lVar8 + 1;
              dVar10 = dVar11 * dVar10;
            } while ((int)(uVar7 + (int)lVar8) < iVar3 + iVar2 + -1);
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)nt);
    }
    return;
  case 7:
    dVar11 = r8_abs(b - a);
    if (dVar9 < dVar11) {
      local_38 = (a + b) * 0.5;
      dVar11 = (b - a) * 0.5;
      goto LAB_001d6c22;
    }
    break;
  case 8:
    dVar11 = b + a;
    dVar9 = beta;
    if (dVar11 <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      pcVar5 = "  A + B <= 0.\n";
      goto LAB_001d6d18;
    }
    goto LAB_001d6c27;
  case 9:
    dVar11 = r8_abs(b - a);
    if (dVar9 < dVar11) {
      alpha = 0.5;
      goto LAB_001d6bf8;
    }
    break;
  default:
    alpha = 0.0;
    local_38 = 0.0;
    dVar9 = 0.0;
    goto LAB_001d6c27;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
  pcVar5 = "  |B - A| too small.\n";
LAB_001d6d18:
  std::operator<<((ostream *)&std::cerr,pcVar5);
  exit(1);
}

Assistant:

void scqf ( int nt, double t[], int mlt[], double wts[], int /*nwts*/, int ndx[], 
  double swts[], double st[], int kind, double alpha, double beta, double a, 
  double b )

//****************************************************************************80
//
//  Purpose:
//
//    SCQF scales a quadrature formula to a nonstandard interval.
//
//  Discussion:
//
//    The arrays WTS and SWTS may coincide.
//
//    The arrays T and ST may coincide.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 February 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int NT, the number of knots.
//
//    Input, double T[NT], the original knots.
//
//    Input, int MLT[NT], the multiplicity of the knots.
//
//    Input, double WTS[NWTS], the weights.
//
//    Input, int NWTS, the number of weights.
//
//    Input, int NDX[NT], used to index the array WTS.  
//    For more details see the comments in CAWIQ.
//
//    Output, double SWTS[NWTS], the scaled weights.
//
//    Output, double ST[NT], the scaled knots.
//
//    Input, int KIND, the rule.
//    1, Legendre,             (a,b)       1.0
//    2, Chebyshev Type 1,     (a,b)       ((b-x)*(x-a))^(-0.5)
//    3, Gegenbauer,           (a,b)       ((b-x)*(x-a))^alpha
//    4, Jacobi,               (a,b)       (b-x)^alpha*(x-a)^beta
//    5, Generalized Laguerre, (a,+oo)     (x-a)^alpha*exp(-b*(x-a))
//    6, Generalized Hermite,  (-oo,+oo)   |x-a|^alpha*exp(-b*(x-a)^2)
//    7, Exponential,          (a,b)       |x-(a+b)/2.0|^alpha
//    8, Rational,             (a,+oo)     (x-a)^alpha*(x+b)^beta
//    9, Chebyshev Type 2,     (a,b)       ((b-x)*(x-a))^(+0.5)
//
//    Input, double ALPHA, the value of Alpha, if needed.
//
//    Input, double BETA, the value of Beta, if needed.
//
//    Input, double A, B, the interval endpoints.
//
{
  double al = 0.0; // Silence uninitialized warning.
  double be = 0.0; // Silence uninitialized warning.
  int i;
  int k;
  int l;
  double p;
  double shft = 0.0; // Silence uninitialized warning.
  double slp = 0.0; // Silence uninitialized warning.
  double temp;
  double tmp;

  temp = r8_epsilon ( );

  parchk ( kind, 1, alpha, beta );

  if ( kind == 1 )
  {
    al = 0.0;
    be = 0.0;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 2 )
  {
    al = -0.5;
    be = -0.5;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 3 )
  {
    al = alpha;
    be = alpha;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 4 )
  {
    al = alpha;
    be = beta;

    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 5 )
  {
    if ( b <= 0.0 )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  B <= 0\n";
      exit ( 1 );
    }
    shft = a;
    slp = 1.0 / b;
    al = alpha;
    be = 0.0;
  }
  else if ( kind == 6 )
  {
    if ( b <= 0.0 )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  B <= 0.\n";
      exit ( 1 );
    }
    shft = a;
    slp = 1.0 / sqrt ( b );
    al = alpha;
    be = 0.0;
  }
  else if ( kind == 7 )
  {
    al = alpha;
    be = 0.0;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 8 )
  {
    if ( a + b <= 0.0 )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  A + B <= 0.\n";
      exit ( 1 );
    }
    shft = a;
    slp = a + b;
    al = alpha;
    be = beta;
  }
  else if ( kind == 9 )
  {
    al = 0.5;
    be = 0.5;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }

  p = pow ( slp, al + be + 1.0 );

  for ( k = 0; k < nt; k++ )
  {
    st[k] = shft + slp * t[k];
    l = abs ( ndx[k] );

    if ( l != 0 )
    {
      tmp = p;
      for ( i = l - 1; i <= l - 1 + mlt[k] - 1; i++ )
      {
        swts[i] = wts[i] * tmp;
        tmp = tmp * slp;
      }
    }
  }
  return;
}